

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Quat<double> * __thiscall Imath_3_2::Quat<double>::operator*=(Quat<double> *this,Quat<double> *q)

{
  undefined8 *in_RSI;
  Quat<double> *in_RDI;
  double dVar1;
  double rtmp;
  Vec3<double> *v;
  Vec3<double> *this_00;
  Vec3<double> local_30;
  double local_18;
  
  this_00 = (Vec3<double> *)in_RDI->r;
  v = (Vec3<double> *)*in_RSI;
  dVar1 = Vec3<double>::operator^(this_00,v);
  local_18 = (double)this_00 * (double)v + -dVar1;
  Imath_3_2::operator*((double)in_RDI,this_00);
  Vec3<double>::operator*((Vec3<double> *)in_RDI,(double)this_00);
  Vec3<double>::operator+((Vec3<double> *)in_RDI,this_00);
  Vec3<double>::operator%((Vec3<double> *)in_RDI,this_00);
  Vec3<double>::operator+((Vec3<double> *)in_RDI,this_00);
  Vec3<double>::operator=(&in_RDI->v,&local_30);
  in_RDI->r = local_18;
  return in_RDI;
}

Assistant:

const Quat<T>&
Quat<T>::operator*= (const Quat<T>& q) IMATH_NOEXCEPT
{
    T rtmp = r * q.r - (v ^ q.v);
    v      = r * q.v + v * q.r + v % q.v;
    r      = rtmp;
    return *this;
}